

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecAnalyzerSettings.cpp
# Opt level: O2

void __thiscall HdmiCecAnalyzerSettings::LoadSettings(HdmiCecAnalyzerSettings *this,char *settings)

{
  char *pcVar1;
  SimpleArchive text_archive;
  
  SimpleArchive::SimpleArchive(&text_archive);
  SimpleArchive::SetString((char *)&text_archive);
  SimpleArchive::operator>>(&text_archive,&this->mCecChannel);
  AnalyzerSettings::ClearChannels();
  pcVar1 = HdmiCec::GetProtocolName();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mCecChannel,SUB81(pcVar1,0));
  UpdateInterfacesFromSettings(this);
  SimpleArchive::~SimpleArchive(&text_archive);
  return;
}

Assistant:

void HdmiCecAnalyzerSettings::LoadSettings( const char* settings )
{
    SimpleArchive text_archive;
    text_archive.SetString( settings );

    text_archive >> mCecChannel;

    ClearChannels();
    AddChannel( mCecChannel, HdmiCec::GetProtocolName(), true );

    UpdateInterfacesFromSettings();
}